

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::NetSymbol::checkInitializer(NetSymbol *this)

{
  Scope *this_00;
  bool bVar1;
  Expression *this_01;
  
  this_01 = DeclaredType::getInitializer(&(this->super_ValueSymbol).declaredType);
  this_00 = (this->super_ValueSymbol).super_Symbol.parentScope;
  if ((this_00 != (Scope *)0x0 && this_01 != (Expression *)0x0) &&
     (this_00->thisSym->kind == Package)) {
    bVar1 = Expression::bad(this_01);
    if (!bVar1) {
      Scope::addDiag(this_00,(DiagCode)0x950006,this_01->sourceRange);
      return;
    }
  }
  return;
}

Assistant:

void NetSymbol::checkInitializer() const {
    // Disallow initializers inside packages. Enforcing this check requires knowing
    // about user-defined nettypes, which is why we can't just do it in the parser.
    auto init = getInitializer();
    auto parent = getParentScope();
    if (init && parent && parent->asSymbol().kind == SymbolKind::Package && !init->bad())
        parent->addDiag(diag::PackageNetInit, init->sourceRange);
}